

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O0

void __thiscall
pstore::
error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
::
move_construct<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
          (error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
           *this,error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                 *rhs)

{
  error_code *peVar1;
  storage_type *this_00;
  storage_type *__in;
  error_code eVar2;
  error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
  *rhs_local;
  error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
  *this_local;
  
  this[0x18] = (error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                )(rhs->has_error_ & 1);
  if (((byte)this[0x18] & 1) == 0) {
    this_00 = error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
              ::get_storage((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                             *)this);
    __in = error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
           ::get_storage(rhs);
    std::
    tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>
    ::
    tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>,_true>
              (this_00,__in);
  }
  else {
    peVar1 = error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
             ::get_error_storage((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                                  *)this);
    eVar2 = error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
            ::get_error(rhs);
    peVar1->_M_value = eVar2._M_value;
    peVar1->_M_cat = eVar2._M_cat;
  }
  return;
}

Assistant:

void error_or<T>::move_construct (error_or<Other> && rhs) noexcept {
        has_error_ = rhs.has_error_;
        if (has_error_) {
            new (get_error_storage ()) std::error_code (rhs.get_error ());
        } else {
            new (get_storage ()) storage_type (std::move (*rhs.get_storage ()));
        }
    }